

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ExternalCommand::configureDescription
          (ExternalCommand *this,ConfigureContext *param_1,StringRef value)

{
  string local_48;
  ConfigureContext *local_28;
  ConfigureContext *param_1_local;
  ExternalCommand *this_local;
  StringRef value_local;
  
  value_local.Data = (char *)value.Length;
  this_local = (ExternalCommand *)value.Data;
  local_28 = param_1;
  param_1_local = (ConfigureContext *)this;
  llvm::StringRef::operator_cast_to_string(&local_48,(StringRef *)&this_local);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ExternalCommand::configureDescription(const ConfigureContext&,
                                           StringRef value) {
  description = value;
}